

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QCss::AttributeSelector>::emplace<QCss::AttributeSelector_const&>
          (QMovableArrayOps<QCss::AttributeSelector> *this,qsizetype i,AttributeSelector *args)

{
  AttributeSelector **ppAVar1;
  AttributeSelector *pAVar2;
  ValueMatchType VVar3;
  Data *pDVar4;
  long lVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  AttributeSelector *pAVar12;
  qsizetype *pqVar13;
  bool bVar14;
  
  pDVar4 = (this->super_QGenericArrayOps<QCss::AttributeSelector>).
           super_QArrayDataPointer<QCss::AttributeSelector>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar5 = (this->super_QGenericArrayOps<QCss::AttributeSelector>).
            super_QArrayDataPointer<QCss::AttributeSelector>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<QCss::AttributeSelector>).
                      super_QArrayDataPointer<QCss::AttributeSelector>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x6db6db6db6db6db7)) {
      pAVar12 = (this->super_QGenericArrayOps<QCss::AttributeSelector>).
                super_QArrayDataPointer<QCss::AttributeSelector>.ptr;
      pDVar6 = (args->name).d.d;
      pAVar12[lVar5].name.d.d = pDVar6;
      pAVar12[lVar5].name.d.ptr = (args->name).d.ptr;
      pAVar12[lVar5].name.d.size = (args->name).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar6 = (args->value).d.d;
      pAVar12[lVar5].value.d.d = pDVar6;
      pAVar12[lVar5].value.d.ptr = (args->value).d.ptr;
      pAVar12[lVar5].value.d.size = (args->value).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pAVar12[lVar5].valueMatchCriterium = args->valueMatchCriterium;
      goto LAB_005fbc3f;
    }
    if (((i == 0) && (pDVar4 != (Data *)0x0)) &&
       ((AttributeSelector *)
        ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
        (this->super_QGenericArrayOps<QCss::AttributeSelector>).
        super_QArrayDataPointer<QCss::AttributeSelector>.ptr)) {
      pAVar12 = (this->super_QGenericArrayOps<QCss::AttributeSelector>).
                super_QArrayDataPointer<QCss::AttributeSelector>.ptr;
      pDVar6 = (args->name).d.d;
      pAVar12[-1].name.d.d = pDVar6;
      pAVar12[-1].name.d.ptr = (args->name).d.ptr;
      pAVar12[-1].name.d.size = (args->name).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar6 = (args->value).d.d;
      pAVar12[-1].value.d.d = pDVar6;
      pAVar12[-1].value.d.ptr = (args->value).d.ptr;
      pAVar12[-1].value.d.size = (args->value).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pAVar12[-1].valueMatchCriterium = args->valueMatchCriterium;
      ppAVar1 = &(this->super_QGenericArrayOps<QCss::AttributeSelector>).
                 super_QArrayDataPointer<QCss::AttributeSelector>.ptr;
      *ppAVar1 = *ppAVar1 + -1;
      goto LAB_005fbc3f;
    }
  }
  pDVar6 = (args->name).d.d;
  pcVar7 = (args->name).d.ptr;
  qVar8 = (args->name).d.size;
  if (pDVar6 != (Data *)0x0) {
    LOCK();
    (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar9 = (args->value).d.d;
  pcVar10 = (args->value).d.ptr;
  qVar11 = (args->value).d.size;
  if (pDVar9 != (Data *)0x0) {
    LOCK();
    (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  VVar3 = args->valueMatchCriterium;
  bVar14 = (this->super_QGenericArrayOps<QCss::AttributeSelector>).
           super_QArrayDataPointer<QCss::AttributeSelector>.size != 0;
  QArrayDataPointer<QCss::AttributeSelector>::detachAndGrow
            ((QArrayDataPointer<QCss::AttributeSelector> *)this,(uint)(i == 0 && bVar14),1,
             (AttributeSelector **)0x0,(QArrayDataPointer<QCss::AttributeSelector> *)0x0);
  pAVar12 = (this->super_QGenericArrayOps<QCss::AttributeSelector>).
            super_QArrayDataPointer<QCss::AttributeSelector>.ptr;
  if (i == 0 && bVar14) {
    pAVar12[-1].name.d.d = pDVar6;
    pAVar12[-1].name.d.ptr = pcVar7;
    pAVar12[-1].name.d.size = qVar8;
    pAVar12[-1].value.d.d = pDVar9;
    pAVar12[-1].value.d.ptr = pcVar10;
    pAVar12[-1].value.d.size = qVar11;
    pAVar12[-1].valueMatchCriterium = VVar3;
    (this->super_QGenericArrayOps<QCss::AttributeSelector>).
    super_QArrayDataPointer<QCss::AttributeSelector>.ptr = pAVar12 + -1;
  }
  else {
    pAVar2 = pAVar12 + i;
    memmove(pAVar2 + 1,pAVar12 + i,
            ((this->super_QGenericArrayOps<QCss::AttributeSelector>).
             super_QArrayDataPointer<QCss::AttributeSelector>.size - i) * 0x38);
    (pAVar2->name).d.d = pDVar6;
    (pAVar2->name).d.ptr = pcVar7;
    (pAVar2->name).d.size = qVar8;
    (pAVar2->value).d.d = pDVar9;
    (pAVar2->value).d.ptr = pcVar10;
    (pAVar2->value).d.size = qVar11;
    pAVar2->valueMatchCriterium = VVar3;
  }
LAB_005fbc3f:
  pqVar13 = &(this->super_QGenericArrayOps<QCss::AttributeSelector>).
             super_QArrayDataPointer<QCss::AttributeSelector>.size;
  *pqVar13 = *pqVar13 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }